

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O0

int __thiscall CVmUTF8Source::seek(CVmUTF8Source *this,long ofs,int mode)

{
  size_t sVar1;
  int in_EDX;
  long in_RSI;
  char *in_RDI;
  utf8_ptr p;
  undefined4 in_stack_ffffffffffffffd0;
  long local_18;
  
  local_18 = in_RSI;
  if (in_EDX != 0) {
    if (in_EDX == 1) {
      local_18 = *(long *)(in_RDI + 0x28) + in_RSI;
    }
    else {
      if (in_EDX != 2) {
        return 1;
      }
      local_18 = *(long *)(in_RDI + 0x18) + in_RSI;
    }
  }
  if (local_18 < 0) {
    local_18 = 0;
  }
  else if (*(long *)(in_RDI + 0x18) < local_18) {
    local_18 = *(long *)(in_RDI + 0x18);
  }
  *(long *)(in_RDI + 0x28) = local_18;
  utf8_ptr::utf8_ptr((utf8_ptr *)CONCAT44(in_EDX,in_stack_ffffffffffffffd0),in_RDI);
  sVar1 = utf8_ptr::bytelen((utf8_ptr *)CONCAT44(in_EDX,in_stack_ffffffffffffffd0),(size_t)in_RDI);
  *(size_t *)(in_RDI + 0x20) = sVar1;
  return 0;
}

Assistant:

virtual int seek(long ofs, int mode)
    {
        /* figure the absolute position based on the mode */
        switch (mode)
        {
        case OSFSK_SET:
            /* set - the offset is already absolute */
            break;

        case OSFSK_CUR:
            /* relative to current index */
            ofs += charidx;
            break;

        case OSFSK_END:
            /* relative to the end of file */
            ofs += charlen;
            break;
            
        default:
            /* invalid mode - return an error */
            return 1;
        }

        /* limit the position to the bounds of the string */
        if (ofs < 0)
            ofs = 0;
        else if (ofs > (long)charlen)
            ofs = (long)charlen;

        /* 
         *   The caller is working with the stream: the byte index in the
         *   stream equals the character index in the string.
         */
        charidx = (size_t)ofs;

        /* calculate the byte index for the new character index */
        utf8_ptr p((char *)str);
        byteidx = p.bytelen(charidx);

        /* success */
        return 0;
    }